

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__shiftsigned(uint v,int shift,int bits)

{
  bool local_15;
  int bits_local;
  int shift_local;
  uint v_local;
  
  if (shift < 0) {
    bits_local = v << (-(byte)shift & 0x1f);
  }
  else {
    bits_local = v >> ((byte)shift & 0x1f);
  }
  if (0xff < (uint)bits_local) {
    __assert_fail("v < 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                  ,0x148e,"int stbi__shiftsigned(unsigned int, int, int)");
  }
  local_15 = 8 < (uint)bits;
  if (local_15) {
    __assert_fail("bits >= 0 && bits <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                  ,0x1490,"int stbi__shiftsigned(unsigned int, int, int)");
  }
  return (int)(((uint)bits_local >> (8U - (char)bits & 0x1f)) * stbi__shiftsigned::mul_table[bits])
         >> ((byte)stbi__shiftsigned::shift_table[bits] & 0x1f);
}

Assistant:

static int stbi__shiftsigned(unsigned int v, int shift, int bits)
{
   static unsigned int mul_table[9] = {
      0,
      0xff/*0b11111111*/, 0x55/*0b01010101*/, 0x49/*0b01001001*/, 0x11/*0b00010001*/,
      0x21/*0b00100001*/, 0x41/*0b01000001*/, 0x81/*0b10000001*/, 0x01/*0b00000001*/,
   };
   static unsigned int shift_table[9] = {
      0, 0,0,1,0,2,4,6,0,
   };
   if (shift < 0)
      v <<= -shift;
   else
      v >>= shift;
   STBI_ASSERT(v < 256);
   v >>= (8-bits);
   STBI_ASSERT(bits >= 0 && bits <= 8);
   return (int) ((unsigned) v * mul_table[bits]) >> shift_table[bits];
}